

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect.h
# Opt level: O0

void pbrt::EnqueueWorkAfterIntersection
               (RayWorkItem *r,Medium *rayMedium,float tMax,SurfaceInteraction *intr,
               MediumSampleQueue *mediumSampleQueue,RayQueue *nextRayQueue,
               HitAreaLightQueue *hitAreaLightQueue,MaterialEvalQueue *basicEvalMaterialQueue,
               MaterialEvalQueue *universalEvalMaterialQueue)

{
  initializer_list<pbrt::SpectrumTexture> stex;
  Vector3f d;
  undefined1 auVar1 [64];
  MixMaterial *pMVar2;
  bool bVar3;
  undefined8 *in_RDX;
  TaggedPointer *in_RSI;
  long in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  Vector3<float> VVar8;
  Point3f PVar9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  anon_class_464_4_6144f408 enqueue;
  MaterialEvalQueue *q;
  FloatTexture displacement;
  Ray newRay;
  MaterialEvalContext ctx;
  MixMaterial *mix;
  Material material;
  MediumInterface mediumInterface;
  SurfaceInteraction *in_stack_fffffffffffff8e8;
  SurfaceInteraction *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  WorkQueue<pbrt::MediumSampleWorkItem> *in_stack_fffffffffffff910;
  BasicTextureEvaluator *in_stack_fffffffffffff928;
  Interaction *in_stack_fffffffffffff930;
  size_type in_stack_fffffffffffff938;
  initializer_list<pbrt::FloatTexture> in_stack_fffffffffffff940;
  undefined8 local_6a0;
  Interaction *in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff9a2;
  undefined1 in_stack_fffffffffffff9a3;
  Float in_stack_fffffffffffff9a4;
  SampledSpectrum *in_stack_fffffffffffff9a8;
  SampledSpectrum *in_stack_fffffffffffff9b0;
  float in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  int in_stack_fffffffffffff9c4;
  Ray *in_stack_fffffffffffff9c8;
  RayQueue *in_stack_fffffffffffff9d0;
  SampledSpectrum *in_stack_fffffffffffff9e0;
  SampledWavelengths *in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffffa00;
  initializer_list<pbrt::SpectrumTexture> local_498;
  undefined1 local_488 [8];
  undefined1 *local_480;
  undefined8 local_478;
  undefined8 local_468;
  TaggedPointer local_460 [8];
  undefined8 local_458;
  float local_450;
  undefined8 local_440;
  float local_438;
  undefined8 local_434;
  undefined4 local_42c;
  undefined8 local_428;
  undefined8 local_420;
  undefined4 local_418;
  undefined8 local_414;
  undefined8 local_40c;
  undefined8 local_404;
  undefined8 local_3fc;
  undefined4 local_3f4;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined1 auStack_3c0 [48];
  undefined4 local_390;
  undefined4 local_38c;
  undefined8 local_388;
  undefined4 local_380;
  undefined8 local_378;
  undefined4 local_370;
  undefined1 local_2e0 [48];
  undefined1 auStack_2b0 [16];
  undefined1 auStack_2a0 [48];
  MixMaterial local_268 [5];
  MixMaterial *local_1f0;
  Material local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined4 local_150;
  undefined8 uStack_14c;
  undefined8 uStack_144;
  undefined8 local_13c;
  undefined8 uStack_134;
  undefined8 uStack_12c;
  undefined8 uStack_124;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_cc;
  float local_c4;
  undefined8 local_c0;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  undefined4 local_84;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_24;
  
  local_24 = in_ZMM0._0_4_;
  if (in_RDX[8] == 0) {
    Medium::Medium((Medium *)in_stack_fffffffffffff8f0,(Medium *)in_stack_fffffffffffff8e8);
    MediumInterface::MediumInterface
              ((MediumInterface *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (Medium *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  }
  else {
    MediumInterface::MediumInterface
              ((MediumInterface *)in_stack_fffffffffffff8f0,
               (MediumInterface *)in_stack_fffffffffffff8e8);
  }
  bVar3 = TaggedPointer::operator_cast_to_bool(in_RSI);
  if (bVar3) {
    Ray::Ray((Ray *)in_stack_fffffffffffff8f0,(Ray *)in_stack_fffffffffffff8e8);
    local_1a8 = *(undefined4 *)(in_RDI + 0x28);
    local_1a4 = local_24;
    local_1a0 = *(undefined8 *)(in_RDI + 0x2c);
    uStack_198 = *(undefined8 *)(in_RDI + 0x34);
    uStack_190 = *(undefined8 *)(in_RDI + 0x3c);
    uStack_188 = *(undefined8 *)(in_RDI + 0x44);
    local_180 = *(undefined8 *)(in_RDI + 0x50);
    uStack_178 = *(undefined8 *)(in_RDI + 0x58);
    local_170 = *(undefined8 *)(in_RDI + 0x60);
    uStack_168 = *(undefined8 *)(in_RDI + 0x68);
    local_160 = *(undefined8 *)(in_RDI + 0x70);
    uStack_158 = *(undefined8 *)(in_RDI + 0x78);
    local_150 = *(undefined4 *)(in_RDI + 0x4c);
    uStack_14c = *(undefined8 *)(in_RDI + 0x80);
    uStack_144 = *(undefined8 *)(in_RDI + 0x88);
    local_13c = *(undefined8 *)(in_RDI + 0x90);
    uStack_134 = *(undefined8 *)(in_RDI + 0x98);
    uStack_12c = *(undefined8 *)(in_RDI + 0xa0);
    uStack_124 = *(undefined8 *)(in_RDI + 0xa8);
    local_11c = *(undefined4 *)(in_RDI + 0xb4);
    local_118 = *(undefined4 *)(in_RDI + 0xb8);
    local_114 = *(undefined4 *)(in_RDI + 0xb0);
    Light::Light((Light *)in_stack_fffffffffffff8f0,(Light *)in_stack_fffffffffffff8e8);
    local_f8 = in_RDX[2];
    local_108 = *in_RDX;
    uStack_100 = in_RDX[1];
    auVar7 = ZEXT856(uStack_100);
    local_e8 = *(undefined4 *)(in_RDX + 6);
    local_f0 = in_RDX[5];
    local_dc = *(undefined4 *)(in_RDX + 0xb);
    local_e4 = in_RDX[10];
    local_d0 = *(undefined4 *)((long)in_RDX + 100);
    local_d8 = *(undefined8 *)((long)in_RDX + 0x5c);
    VVar8 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff8f0);
    local_1d8 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    local_1e0 = vmovlpd_avx(auVar5._0_16_);
    local_c0 = *(undefined8 *)((long)in_RDX + 0x34);
    local_cc = local_1e0;
    local_c4 = local_1d8;
    Material::Material((Material *)in_stack_fffffffffffff8f0,(Material *)in_stack_fffffffffffff8e8);
    local_b0 = in_RDX[0x10];
    local_a8 = *(undefined4 *)(in_RDX + 0x11);
    local_a4 = *(undefined8 *)((long)in_RDX + 0x8c);
    local_9c = *(undefined4 *)((long)in_RDX + 0x94);
    local_98 = in_RDX[0x13];
    local_90 = *(undefined4 *)(in_RDX + 0x14);
    local_8c = *(undefined8 *)((long)in_RDX + 0xa4);
    local_84 = *(undefined4 *)((long)in_RDX + 0xac);
    local_80 = in_RDX[0x16];
    local_78 = *(undefined4 *)(in_RDX + 0x17);
    local_74 = *(undefined4 *)((long)in_RDX + 0xbc);
    MediumInterface::MediumInterface
              ((MediumInterface *)in_stack_fffffffffffff8f0,
               (MediumInterface *)in_stack_fffffffffffff8e8);
    WorkQueue<pbrt::MediumSampleWorkItem>::Push
              (in_stack_fffffffffffff910,
               (MediumSampleWorkItem *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908)
              );
    return;
  }
  Material::Material((Material *)in_stack_fffffffffffff8f0,(Material *)in_stack_fffffffffffff8e8);
  local_1f0 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
              ::CastOrNullptr<pbrt::MixMaterial>
                        ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                          *)in_stack_fffffffffffff8e8);
  while (auVar7 = in_ZMM0._8_56_, local_1f0 != (MixMaterial *)0x0) {
    MaterialEvalContext::MaterialEvalContext
              ((MaterialEvalContext *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    pMVar2 = local_1f0;
    memcpy(local_2e0,local_268[0].materials,0x70);
    auVar4._48_16_ = auStack_2b0;
    auVar4._0_48_ = local_2e0;
    auVar4 = vmovdqu64_avx512f(auVar4);
    auVar1._16_48_ = auStack_2a0;
    auVar1._0_16_ = auStack_2b0;
    auVar5 = vmovdqu64_avx512f(auVar1);
    auVar5 = vmovdqu64_avx512f(auVar5);
    in_stack_fffffffffffff928 = auVar5._16_8_;
    in_stack_fffffffffffff930 = auVar5._24_8_;
    in_stack_fffffffffffff938 = auVar5._32_8_;
    in_stack_fffffffffffff940 = auVar5._40_16_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    in_stack_fffffffffffff8e8 = auVar5._0_8_;
    in_stack_fffffffffffff8f0 = auVar5._8_8_;
    in_stack_fffffffffffff8f8 = auVar5._16_4_;
    in_stack_fffffffffffff8fc = auVar5._20_4_;
    in_stack_fffffffffffff900 = auVar5._24_4_;
    in_stack_fffffffffffff904 = auVar5._28_4_;
    in_stack_fffffffffffff908 = auVar5._32_4_;
    in_stack_fffffffffffff90c = auVar5._36_4_;
    in_stack_fffffffffffff910 = auVar5._40_8_;
    in_ZMM0 = ZEXT1664(auVar4._0_16_);
    MixMaterial::ChooseMaterial<pbrt::BasicTextureEvaluator>(local_268,pMVar2);
    Material::operator=((Material *)in_stack_fffffffffffff8f0,(Material *)in_stack_fffffffffffff8e8)
    ;
    local_1f0 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                ::CastOrNullptr<pbrt::MixMaterial>
                          ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                            *)in_stack_fffffffffffff8e8);
  }
  bVar3 = TaggedPointer::operator_cast_to_bool((TaggedPointer *)&local_1e8);
  if (!bVar3) {
    local_380 = *(undefined4 *)(in_RDI + 0x14);
    local_388 = *(undefined8 *)(in_RDI + 0xc);
    d.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9b8;
    d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff9b0;
    local_378 = local_388;
    local_370 = local_380;
    Interaction::SpawnRay(in_stack_fffffffffffff998,d);
    Ray::Ray((Ray *)in_stack_fffffffffffff8f0,(Ray *)in_stack_fffffffffffff8e8);
    RayQueue::PushIndirectRay
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
               (LightSampleContext *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9e0,
               in_stack_fffffffffffff9e8,in_stack_fffffffffffff9a4,(bool)in_stack_fffffffffffff9a3,
               (bool)in_stack_fffffffffffff9a2,in_stack_fffffffffffffa00);
    return;
  }
  bVar3 = TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDX + 0x19));
  if (bVar3) {
    Light::Light((Light *)in_stack_fffffffffffff8f0,(Light *)in_stack_fffffffffffff8e8);
    PVar9 = Interaction::p(in_stack_fffffffffffff930);
    local_450 = PVar9.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_458 = vmovlpd_avx(auVar6._0_16_);
    local_434 = in_RDX[5];
    local_42c = *(undefined4 *)(in_RDX + 6);
    local_428 = *(undefined8 *)((long)in_RDX + 0x34);
    local_420 = *(undefined8 *)((long)in_RDX + 0x1c);
    local_418 = *(undefined4 *)((long)in_RDX + 0x24);
    local_414 = *(undefined8 *)(in_RDI + 0x2c);
    local_40c = *(undefined8 *)(in_RDI + 0x34);
    local_404 = *(undefined8 *)(in_RDI + 0x3c);
    local_3fc = *(undefined8 *)(in_RDI + 0x44);
    local_3f4 = *(undefined4 *)(in_RDI + 0x28);
    local_3f0 = *(undefined8 *)(in_RDI + 0x50);
    local_3e8 = *(undefined8 *)(in_RDI + 0x58);
    local_3e0 = *(undefined8 *)(in_RDI + 0x60);
    local_3d8 = *(undefined8 *)(in_RDI + 0x68);
    local_3d0 = *(undefined8 *)(in_RDI + 0x70);
    local_3c8 = *(undefined8 *)(in_RDI + 0x78);
    local_440 = local_458;
    local_438 = local_450;
    memcpy(auStack_3c0,(void *)(in_RDI + 0x80),0x30);
    local_390 = *(undefined4 *)(in_RDI + 0xb4);
    local_38c = *(undefined4 *)(in_RDI + 0x4c);
    WorkQueue<pbrt::HitAreaLightWorkItem>::Push
              ((WorkQueue<pbrt::HitAreaLightWorkItem> *)in_stack_fffffffffffff910,
               (HitAreaLightWorkItem *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908)
              );
  }
  Material::GetDisplacement
            ((Material *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  bVar3 = Material::CanEvaluateTextures<pbrt::BasicTextureEvaluator>(&local_1e8);
  if (bVar3) {
    bVar3 = TaggedPointer::operator_cast_to_bool(local_460);
    if (bVar3) {
      FloatTexture::FloatTexture
                ((FloatTexture *)in_stack_fffffffffffff8f0,(FloatTexture *)in_stack_fffffffffffff8e8
                );
      local_480 = local_488;
      local_478 = 1;
      std::initializer_list<pbrt::SpectrumTexture>::initializer_list(&local_498);
      stex._M_len = in_stack_fffffffffffff938;
      stex._M_array = (iterator)in_stack_fffffffffffff930;
      bVar3 = BasicTextureEvaluator::CanEvaluate
                        (in_stack_fffffffffffff928,in_stack_fffffffffffff940,stex);
      if (!bVar3) goto LAB_00a0db8a;
    }
    local_6a0 = in_stack_00000008;
  }
  else {
LAB_00a0db8a:
    local_6a0 = in_stack_00000010;
  }
  local_468 = local_6a0;
  SurfaceInteraction::SurfaceInteraction(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  RayWorkItem::RayWorkItem
            ((RayWorkItem *)in_stack_fffffffffffff8f0,(RayWorkItem *)in_stack_fffffffffffff8e8);
  MediumInterface::MediumInterface
            ((MediumInterface *)in_stack_fffffffffffff8f0,
             (MediumInterface *)in_stack_fffffffffffff8e8);
  TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
  ::
  Dispatch<pbrt::EnqueueWorkAfterIntersection(pbrt::RayWorkItem,pbrt::Medium,float,pbrt::SurfaceInteraction,pbrt::MediumSampleQueue*,pbrt::RayQueue*,pbrt::WorkQueue<pbrt::HitAreaLightWorkItem>*,pbrt::MultiWorkQueue<pbrt::TypePack<pbrt::MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial>,pbrt::MaterialEvalWorkItem<pbrt::CoatedConductorMaterial>,pbrt::MaterialEvalWorkItem<pbrt::ConductorMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DielectricMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DiffuseMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial>,pbrt::MaterialEvalWorkItem<pbrt::HairMaterial>,pbrt::MaterialEvalWorkItem<pbrt::MeasuredMaterial>,pbrt::MaterialEvalWorkItem<pbrt::SubsurfaceMaterial>,pbrt::MaterialEvalWorkItem<pbrt::ThinDielectricMaterial>,pbrt::MaterialEvalWorkItem<pbrt::MixMaterial>>>*,pbrt::MultiWorkQueue<pbrt::TypePack<pbrt::MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial>,pbrt::MaterialEvalWorkItem<pbrt::CoatedConductorMaterial>,pbrt::MaterialEvalWorkItem<pbrt::ConductorMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DielectricMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DiffuseMaterial>,pbrt::MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial>,pbrt::MaterialEvalWorkItem<pbrt::HairMaterial>,pbrt::MaterialEvalWorkItem<pbrt::MeasuredMaterial>,pbrt::MaterialEvalWorkItem<pbrt::SubsurfaceMaterial>,pbrt::MaterialEvalWorkItem<pbrt::ThinDielectricMaterial>,pbrt::MaterialEvalWorkItem<pbrt::MixMaterial>>>*)::_lambda(auto:1)_1_&>
            ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
              *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
             (anon_class_464_4_6144f408 *)
             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  return;
}

Assistant:

inline PBRT_CPU_GPU void EnqueueWorkAfterIntersection(
    RayWorkItem r, Medium rayMedium, float tMax, SurfaceInteraction intr,
    MediumSampleQueue *mediumSampleQueue, RayQueue *nextRayQueue,
    HitAreaLightQueue *hitAreaLightQueue, MaterialEvalQueue *basicEvalMaterialQueue,
    MaterialEvalQueue *universalEvalMaterialQueue) {
    MediumInterface mediumInterface =
        intr.mediumInterface ? *intr.mediumInterface : MediumInterface(rayMedium);

    if (rayMedium) {
        assert(mediumSampleQueue);
        PBRT_DBG("Enqueuing into medium sample queue\n");
        mediumSampleQueue->Push(MediumSampleWorkItem{r.ray,
                                                     r.depth,
                                                     tMax,
                                                     r.lambda,
                                                     r.beta,
                                                     r.r_u,
                                                     r.r_l,
                                                     r.pixelIndex,
                                                     r.prevIntrCtx,
                                                     r.specularBounce,
                                                     r.anyNonSpecularBounces,
                                                     r.etaScale,
                                                     intr.areaLight,
                                                     intr.pi,
                                                     intr.n,
                                                     intr.dpdu,
                                                     intr.dpdv,
                                                     -r.ray.d,
                                                     intr.uv,
                                                     intr.material,
                                                     intr.shading.n,
                                                     intr.shading.dpdu,
                                                     intr.shading.dpdv,
                                                     intr.shading.dndu,
                                                     intr.shading.dndv,
                                                     intr.faceIndex,
                                                     mediumInterface});
        return;
    }

    // FIXME: this is all basically duplicate code w/medium.cpp
    Material material = intr.material;

    const MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
    while (mix) {
        MaterialEvalContext ctx(intr);
        material = mix->ChooseMaterial(BasicTextureEvaluator(), ctx);
        mix = material.CastOrNullptr<MixMaterial>();
    }

    if (!material) {
        PBRT_DBG("Enqueuing into medium transition queue: pixel index %d \n",
                 r.pixelIndex);
        Ray newRay = intr.SpawnRay(r.ray.d);
        nextRayQueue->PushIndirectRay(newRay, r.depth, r.prevIntrCtx, r.beta, r.r_u,
                                      r.r_l, r.lambda, r.etaScale, r.specularBounce,
                                      r.anyNonSpecularBounces, r.pixelIndex);
        return;
    }

    if (intr.areaLight) {
        PBRT_DBG("Ray hit an area light: adding to hitAreaLightQueue pixel index %d\n",
                 r.pixelIndex);
        // TODO: intr.wo == -ray.d?
        hitAreaLightQueue->Push(HitAreaLightWorkItem{
            intr.areaLight, intr.p(), intr.n, intr.uv, intr.wo, r.lambda, r.depth, r.beta,
            r.r_u, r.r_l, r.prevIntrCtx, (int)r.specularBounce, r.pixelIndex});
    }

    FloatTexture displacement = material.GetDisplacement();

    MaterialEvalQueue *q =
        (material.CanEvaluateTextures(BasicTextureEvaluator()) &&
         (!displacement || BasicTextureEvaluator().CanEvaluate({displacement}, {})))
            ? basicEvalMaterialQueue
            : universalEvalMaterialQueue;

    PBRT_DBG("Enqueuing for material eval, mtl tag %d\n", material.Tag());

    auto enqueue = [=](auto ptr) {
        using Material = typename std::remove_reference_t<decltype(*ptr)>;
        q->Push(MaterialEvalWorkItem<Material>{ptr,
                                               intr.pi,
                                               intr.n,
                                               intr.dpdu,
                                               intr.dpdv,
                                               intr.time,
                                               r.depth,
                                               intr.shading.n,
                                               intr.shading.dpdu,
                                               intr.shading.dpdv,
                                               intr.shading.dndu,
                                               intr.shading.dndv,
                                               intr.uv,
                                               intr.faceIndex,
                                               r.lambda,
                                               r.pixelIndex,
                                               r.anyNonSpecularBounces,
                                               intr.wo,
                                               r.beta,
                                               r.r_u,
                                               r.etaScale,
                                               mediumInterface});
    };
    material.Dispatch(enqueue);

    PBRT_DBG("Closest hit found intersection at t %f\n", tMax);
}